

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetching.c
# Opt level: O0

int fetch_all_calendar_dates_db(feed_db_t *db,calendar_date_t **records)

{
  int iVar1;
  void *pvVar2;
  uchar *puVar3;
  char local_c8 [8];
  char qr [63];
  sqlite3_stmt *stmt;
  int i;
  int record_count;
  feed_db_status_t res;
  calendar_date_t record;
  calendar_date_t **records_local;
  feed_db_t *db_local;
  
  record._72_8_ = records;
  db_local._4_4_ = count_rows_db(db,"calendar_dates");
  stmt._4_4_ = 0;
  if (0 < db_local._4_4_) {
    memcpy(local_c8,"SELECT service_id, date, exception_type FROM `calendar_dates`;",0x3f);
    sqlite3_prepare_v2(db->conn,local_c8,-1,(sqlite3_stmt **)(qr + 0x38),(char **)0x0);
    pvVar2 = malloc((long)db_local._4_4_ * 0x50);
    *(void **)record._72_8_ = pvVar2;
    if (*(long *)record._72_8_ == 0) {
      sqlite3_finalize(stack0xffffffffffffff78);
      db_local._4_4_ = -1;
    }
    else {
      do {
        iVar1 = sqlite3_step(stack0xffffffffffffff78);
        db->rc = iVar1;
        if (iVar1 != 100) break;
        init_calendar_date((calendar_date_t *)&record_count);
        puVar3 = sqlite3_column_text(stack0xffffffffffffff78,0);
        strcpy((char *)&record_count,(char *)puVar3);
        puVar3 = sqlite3_column_text(stack0xffffffffffffff78,1);
        strcpy(record.service_id + 0x38,(char *)puVar3);
        record.date._4_4_ = sqlite3_column_int(stack0xffffffffffffff78,2);
        memcpy((void *)(*(long *)record._72_8_ + (long)stmt._4_4_ * 0x50),&record_count,0x50);
        stmt._4_4_ = stmt._4_4_ + 1;
      } while (stmt._4_4_ < db_local._4_4_);
      sqlite3_finalize(stack0xffffffffffffff78);
    }
  }
  return db_local._4_4_;
}

Assistant:

int fetch_all_calendar_dates_db(feed_db_t *db, calendar_date_t **records) {

    calendar_date_t record;
    feed_db_status_t res;

    int record_count = count_rows_db(db, "calendar_dates");
    int i = 0;

    if (record_count < 1) {
        return record_count;
    }

    sqlite3_stmt *stmt;
    char qr[] = "SELECT "
                    "service_id, date, exception_type "
                "FROM `calendar_dates`;";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    *records = malloc(record_count * sizeof(**records));
    if (*records == NULL) {
        sqlite3_finalize(stmt);
        return -1;
    }

    while ((db->rc = sqlite3_step(stmt)) == SQLITE_ROW) {
        init_calendar_date(&record);

        strcpy(record.service_id, sqlite3_column_text(stmt, 0));
        strcpy(record.date, sqlite3_column_text(stmt, 1));
        record.exception_type = (exception_type_t)sqlite3_column_int(stmt, 2);

        (*records)[i] = record;
        i++;

        if (i >= record_count)
            break;
    }

    sqlite3_finalize(stmt);
    return record_count;
}